

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void restoration_search(AV1_COMMON *cm,int plane,RestSearchCtxt *rsc,_Bool *disable_lr_filter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int plane_00;
  int iVar10;
  byte bVar11;
  long in_RCX;
  void *in_RDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  RestorationType r;
  int unit_idx;
  int w;
  int remaining_w;
  int x0;
  int rcol;
  int voffset;
  int h;
  int remaining_h;
  int y0;
  int rrow;
  RestorationTileLimits limits;
  int has_lr_info;
  int rrow1;
  int rrow0;
  int rcol1;
  int rcol0;
  int mi_col;
  int sb_col;
  int mi_row;
  int sb_row;
  int sb_col_end;
  int sb_col_start;
  int tile_col;
  int sb_row_end;
  int sb_row_start;
  int tile_row;
  RestorationType num_rtypes;
  int plane_num_units;
  int plane_h;
  int plane_w;
  int ext_size;
  int ru_size;
  RestorationInfo *rsi;
  int ss_y;
  int is_uv;
  CommonTileParams *tiles;
  int mib_size_log2;
  BLOCK_SIZE sb_size;
  undefined1 *in_stack_ffffffffffffff10;
  int local_e0;
  int local_dc;
  int local_d8;
  bool local_d1;
  uint local_d0;
  int local_bc;
  int local_a8;
  RestorationTileLimits local_a4;
  int local_94;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int iVar12;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar13;
  int local_68;
  int iVar14;
  int iVar15;
  int iVar16;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  
  iVar1 = in_RDI->seq_params->mib_size_log2;
  local_d1 = false;
  if (0 < in_ESI != 0) {
    local_d1 = in_RDI->seq_params->subsampling_y != 0;
  }
  iVar2 = in_RDI->rst_info[in_ESI].restoration_unit_size;
  iVar6 = (iVar2 * 3) / 2;
  av1_get_upsampled_plane_size
            (in_RDI,(uint)(0 < in_ESI),(int *)&stack0xffffffffffffffb4,
             (int *)&stack0xffffffffffffffb0);
  iVar16 = in_RDI->rst_info[in_ESI].num_rest_units;
  uVar7 = 3;
  if (1 < iVar16) {
    uVar7 = 4;
  }
  reset_rsc((RestSearchCtxt *)0x2c593e);
  local_a8 = in_stack_ffffffffffffff74;
  local_bc = in_stack_ffffffffffffff7c;
  for (iVar15 = 0; iVar15 < (in_RDI->tiles).rows; iVar15 = iVar15 + 1) {
    iVar3 = (in_RDI->tiles).row_start_sb[iVar15 + 1];
    iVar10 = (in_RDI->tiles).row_start_sb[iVar15];
    for (local_68 = 0; local_68 < (in_RDI->tiles).cols; local_68 = local_68 + 1) {
      iVar4 = (in_RDI->tiles).col_start_sb[local_68];
      iVar5 = (in_RDI->tiles).col_start_sb[local_68 + 1];
      rsc_on_tile(in_stack_ffffffffffffff10);
      iVar14 = iVar10;
      for (; iVar10 < iVar3; iVar10 = iVar10 + 1) {
        bVar11 = (byte)iVar1;
        iVar8 = iVar10 << (bVar11 & 0x1f);
        for (plane_00 = iVar4; plane_00 < iVar5; plane_00 = plane_00 + 1) {
          in_stack_ffffffffffffff10 = &stack0xffffffffffffff74;
          local_94 = av1_loop_restoration_corners_in_sb
                               ((AV1Common *)CONCAT44(iVar10,iVar8),plane_00,
                                plane_00 << (bVar11 & 0x1f),local_bc,
                                (BLOCK_SIZE)((uint)in_stack_ffffffffffffff78 >> 0x18),
                                (int *)CONCAT44(local_a8,in_stack_ffffffffffffff70),
                                (int *)CONCAT44(iVar15,iVar14),(int *)CONCAT44(iVar16,uVar7),
                                (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                               );
          iVar12 = local_a8;
          if (local_94 != 0) {
            for (; local_a8 < in_stack_ffffffffffffff70; local_a8 = local_a8 + 1) {
              local_dc = local_a8 * iVar2;
              local_d8 = iVar2;
              if (in_stack_ffffffffffffffb0 - local_dc < iVar6) {
                local_d8 = in_stack_ffffffffffffffb0 - local_dc;
              }
              local_a4.v_end = local_dc + local_d8;
              iVar9 = 8 >> local_d1;
              if (local_dc - iVar9 < 0) {
                local_dc = 0;
              }
              else {
                local_dc = local_dc - iVar9;
              }
              local_a4.v_start = local_dc;
              iVar13 = local_bc;
              if (local_a4.v_end < in_stack_ffffffffffffffb0) {
                local_a4.v_end = local_a4.v_end - iVar9;
              }
              for (; local_bc < in_stack_ffffffffffffff78; local_bc = local_bc + 1) {
                local_a4.h_start = local_bc * iVar2;
                local_e0 = iVar2;
                if (in_stack_ffffffffffffffb4 - local_a4.h_start < iVar6) {
                  local_e0 = in_stack_ffffffffffffffb4 - local_a4.h_start;
                }
                local_a4.h_end = local_a4.h_start + local_e0;
                iVar9 = in_RDI->rst_info[in_ESI].horz_units;
                *(undefined1 *)((long)in_RDX + 0x78) = 0;
                for (local_d0 = 0; local_d0 < uVar7; local_d0 = local_d0 + 1) {
                  if ((*(byte *)(in_RCX + (ulong)local_d0) & 1) == 0) {
                    (*restoration_search::funs[local_d0])
                              (&local_a4,local_a8 * iVar9 + local_bc,in_RDX,
                               *(int32_t **)(*(long *)((long)in_RDX + 0x10) + 0x5ae0),
                               (RestorationLineBuffers *)0x0,in_RDI->error);
                  }
                }
              }
              local_bc = iVar13;
            }
          }
          local_a8 = iVar12;
        }
      }
      iVar10 = iVar14;
    }
  }
  return;
}

Assistant:

static void restoration_search(AV1_COMMON *cm, int plane, RestSearchCtxt *rsc,
                               bool *disable_lr_filter) {
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  const CommonTileParams *tiles = &cm->tiles;
  const int is_uv = plane > 0;
  const int ss_y = is_uv && cm->seq_params->subsampling_y;
  RestorationInfo *rsi = &cm->rst_info[plane];
  const int ru_size = rsi->restoration_unit_size;
  const int ext_size = ru_size * 3 / 2;

  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  static const rest_unit_visitor_t funs[RESTORE_TYPES] = {
    search_norestore, search_wiener, search_sgrproj, search_switchable
  };

  const int plane_num_units = rsi->num_rest_units;
  const RestorationType num_rtypes =
      (plane_num_units > 1) ? RESTORE_TYPES : RESTORE_SWITCHABLE_TYPES;

  reset_rsc(rsc);

  // Iterate over restoration units in encoding order, so that each RU gets
  // the correct reference parameters when we cost it up. This is effectively
  // a nested iteration over:
  // * Each tile, order does not matter
  //   * Each superblock within that tile, in raster order
  //     * Each LR unit which is coded within that superblock, in raster order
  for (int tile_row = 0; tile_row < tiles->rows; tile_row++) {
    int sb_row_start = tiles->row_start_sb[tile_row];
    int sb_row_end = tiles->row_start_sb[tile_row + 1];
    for (int tile_col = 0; tile_col < tiles->cols; tile_col++) {
      int sb_col_start = tiles->col_start_sb[tile_col];
      int sb_col_end = tiles->col_start_sb[tile_col + 1];

      // Reset reference parameters for delta-coding at the start of each tile
      rsc_on_tile(rsc);

      for (int sb_row = sb_row_start; sb_row < sb_row_end; sb_row++) {
        int mi_row = sb_row << mib_size_log2;
        for (int sb_col = sb_col_start; sb_col < sb_col_end; sb_col++) {
          int mi_col = sb_col << mib_size_log2;

          int rcol0, rcol1, rrow0, rrow1;
          int has_lr_info = av1_loop_restoration_corners_in_sb(
              cm, plane, mi_row, mi_col, sb_size, &rcol0, &rcol1, &rrow0,
              &rrow1);

          if (!has_lr_info) continue;

          RestorationTileLimits limits;
          for (int rrow = rrow0; rrow < rrow1; rrow++) {
            int y0 = rrow * ru_size;
            int remaining_h = plane_h - y0;
            int h = (remaining_h < ext_size) ? remaining_h : ru_size;

            limits.v_start = y0;
            limits.v_end = y0 + h;
            assert(limits.v_end <= plane_h);
            // Offset upwards to align with the restoration processing stripe
            const int voffset = RESTORATION_UNIT_OFFSET >> ss_y;
            limits.v_start = AOMMAX(0, limits.v_start - voffset);
            if (limits.v_end < plane_h) limits.v_end -= voffset;

            for (int rcol = rcol0; rcol < rcol1; rcol++) {
              int x0 = rcol * ru_size;
              int remaining_w = plane_w - x0;
              int w = (remaining_w < ext_size) ? remaining_w : ru_size;

              limits.h_start = x0;
              limits.h_end = x0 + w;
              assert(limits.h_end <= plane_w);

              const int unit_idx = rrow * rsi->horz_units + rcol;

              rsc->skip_sgr_eval = 0;
              for (RestorationType r = RESTORE_NONE; r < num_rtypes; r++) {
                if (disable_lr_filter[r]) continue;

                funs[r](&limits, unit_idx, rsc, rsc->cm->rst_tmpbuf, NULL,
                        cm->error);
              }
            }
          }
        }
      }
    }
  }
}